

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesDedupOnOptimizedCases_Test::TestBody
          (DescriptorTest_FieldNamesDedupOnOptimizedCases_Test *this)

{
  Descriptor *pDVar1;
  undefined8 extraout_RAX;
  FieldDescriptor *in_RDX;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_02;
  char *pcVar2;
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  AssertHelper local_48 [2];
  btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  local_38;
  char *local_20;
  char *local_18;
  
  local_20 = "field_name1";
  local_18 = "fieldName1";
  pDVar1 = (this->super_DescriptorTest).message4_;
  if (pDVar1->field_count_ < 1) {
    TestBody();
  }
  else {
    TestBody::anon_class_1_0_00000001::operator()
              ((btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&local_38,(anon_class_1_0_00000001 *)pDVar1->fields_,in_RDX);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
    ::operator()(local_58,(char *)&local_20,
                 (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)"collect_unique_names(message4_->field(0))");
    absl::lts_20250127::container_internal::
    btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
    ::~btree(&local_38);
    field = extraout_RDX;
    if (local_58[0] == '\0') {
      testing::Message::Message((Message *)&local_38);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar2 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x3cf,pcVar2);
      testing::internal::AssertHelper::operator=(local_48,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(local_48);
      field = extraout_RDX_00;
      if (local_38.root_ != (node_type *)0x0) {
        (**(code **)(*(long *)local_38.root_ + 8))();
        field = extraout_RDX_01;
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
      field = extraout_RDX_02;
    }
    local_20 = "fieldname7";
    pDVar1 = (this->super_DescriptorTest).message4_;
    if (6 < pDVar1->field_count_) {
      TestBody::anon_class_1_0_00000001::operator()
                ((btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&local_38,(anon_class_1_0_00000001 *)(pDVar1->fields_ + 6),field);
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*>>>
      ::operator()(local_58,(char *)&local_20,
                   (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)"collect_unique_names(message4_->field(6))");
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
      ::~btree(&local_38);
      if (local_58[0] == '\0') {
        testing::Message::Message((Message *)&local_38);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar2 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x3d2,pcVar2);
        testing::internal::AssertHelper::operator=(local_48,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(local_48);
        if (local_38.root_ != (node_type *)0x0) {
          (**(code **)(*(long *)local_38.root_ + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      return;
    }
  }
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(local_48);
  if (local_38.root_ != (node_type *)0x0) {
    (**(code **)(*(long *)local_38.root_ + 8))();
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(DescriptorTest, FieldNamesDedupOnOptimizedCases) {
  const auto collect_unique_names = [](const FieldDescriptor* field) {
    absl::btree_set<absl::string_view> names{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
    // For names following the style guide, verify that we have the same number
    // of string objects as we have string values. That is, duplicate names use
    // the same std::string object. This is for memory efficiency.
    EXPECT_EQ(names.size(),
              (absl::flat_hash_set<const void*>{
                  field->name().data(), field->lowercase_name().data(),
                  field->camelcase_name().data(), field->json_name().data()}
                   .size()))
        << testing::PrintToString(names);
    return names;
  };

  // field_name1
  EXPECT_THAT(collect_unique_names(message4_->field(0)),
              ElementsAre("fieldName1", "field_name1"));
  // fieldname7
  EXPECT_THAT(collect_unique_names(message4_->field(6)),
              ElementsAre("fieldname7"));
}